

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O1

void __thiscall sf::Window::setSize(Window *this,Vector2u *size)

{
  if (this->m_impl != (WindowImpl *)0x0) {
    (*this->m_impl->_vptr_WindowImpl[6])();
    (this->m_size).x = size->x;
    (this->m_size).y = size->y;
    (*this->_vptr_Window[3])(this);
    return;
  }
  return;
}

Assistant:

void Window::setSize(const Vector2u& size)
{
    if (m_impl)
    {
        m_impl->setSize(size);

        // Cache the new size
        m_size.x = size.x;
        m_size.y = size.y;

        // Notify the derived class
        onResize();
    }
}